

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::assert_invariant(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *this)

{
  value_t vVar1;
  object_t *poVar2;
  
  vVar1 = this->m_type;
  poVar2 = (this->m_value).object;
  if (poVar2 == (object_t *)0x0 && vVar1 == object) {
    __assert_fail("m_type != value_t::object or m_value.object != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                  ,0x3d14,
                  "void nlohmann::basic_json<>::assert_invariant() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (vVar1 != array || poVar2 != (object_t *)0x0) {
    if (vVar1 != string || poVar2 != (object_t *)0x0) {
      return;
    }
    __assert_fail("m_type != value_t::string or m_value.string != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                  ,0x3d16,
                  "void nlohmann::basic_json<>::assert_invariant() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  __assert_fail("m_type != value_t::array or m_value.array != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrnexeon[P]dragonbook_cpp_compiler/src/nlohmann/json.hpp"
                ,0x3d15,
                "void nlohmann::basic_json<>::assert_invariant() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
               );
}

Assistant:

void assert_invariant() const noexcept
    {
        assert(m_type != value_t::object or m_value.object != nullptr);
        assert(m_type != value_t::array or m_value.array != nullptr);
        assert(m_type != value_t::string or m_value.string != nullptr);
    }